

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_parse_flags_extension(CBS *cbs,SSLFlags *out,uint8_t *out_alert,bool allow_unknown)

{
  int iVar1;
  size_t __n;
  int line;
  uint8_t padded [4];
  CBS flags;
  CBS copy;
  undefined4 local_3c;
  CBS local_38;
  CBS local_28;
  
  local_28.data = cbs->data;
  local_28.len = cbs->len;
  iVar1 = CBS_get_u8_length_prefixed(&local_28,&local_38);
  if (((iVar1 == 0) || (local_28.len != 0)) || (local_38.len == 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x17f);
    *out_alert = '2';
  }
  else {
    if (local_38.data[local_38.len - 1] == '\0') {
      iVar1 = 0x89;
      line = 0x186;
    }
    else {
      if (local_38.len < 5 || allow_unknown) {
        local_3c = 0;
        __n = 4;
        if (local_38.len < 4) {
          __n = local_38.len;
        }
        memcpy(&local_3c,local_38.data,__n);
      }
      iVar1 = 0xde;
      line = 400;
    }
    ERR_put_error(0x10,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,line);
    *out_alert = '/';
  }
  return false;
}

Assistant:

static bool ssl_parse_flags_extension(const CBS *cbs, SSLFlags *out,
                                      uint8_t *out_alert, bool allow_unknown) {
  CBS copy = *cbs, flags;
  if (!CBS_get_u8_length_prefixed(&copy, &flags) ||  //
      CBS_len(&copy) != 0 ||                         //
      CBS_len(&flags) == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // There may not be any trailing zeros.
  if (CBS_data(&flags)[CBS_len(&flags) - 1] == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // We can only represent flags that fit in SSLFlags, so any bits beyond that
  // are necessarily unsolicited. Unsolicited flags are allowed in CH, CR, and
  // NST, but forbidden in SH, EE, CT, and HRR. See Section 3 of
  // draft-ietf-tls-tlsflags-14.
  if (!allow_unknown && CBS_len(&flags) > sizeof(SSLFlags)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // We currently use the same in-memory and wire representation for flags.
  uint8_t padded[sizeof(SSLFlags)] = {0};
  OPENSSL_memcpy(padded, CBS_data(&flags),
                 std::min(CBS_len(&flags), size_t{4}));
  static_assert(sizeof(SSLFlags) == sizeof(uint32_t),
                "We currently assume SSLFlags is 32-bit");
  *out = CRYPTO_load_u32_le(padded);
  return true;
}